

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  long lVar6;
  float fVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Float FVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [56];
  undefined1 auVar39 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  array<float,_3> aVar79;
  Float triPDF;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  Tuple2<pbrt::Point2,_float> local_150;
  uint local_144;
  uint uStack_140;
  float local_13c;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a0 [88];
  bool local_48;
  Tuple3<pbrt::Point3,_float> local_40;
  undefined1 extraout_var [60];
  
  auVar37._8_56_ = in_register_00001208;
  auVar37._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar29 = auVar37._0_16_;
  local_150 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar29);
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  lVar20 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar18 = (long)this->triIndex;
  lVar23 = *(long *)(lVar20 + 8);
  lVar6 = *(long *)(lVar20 + 0x10);
  lVar19 = (long)*(int *)(lVar23 + lVar18 * 0xc);
  lVar21 = (long)*(int *)(lVar23 + 4 + lVar18 * 0xc);
  lVar22 = (long)*(int *)(lVar23 + 8 + lVar18 * 0xc);
  fVar1 = *(float *)(lVar6 + 8 + lVar19 * 0xc);
  local_138 = ZEXT416(*(uint *)(lVar6 + 8 + lVar21 * 0xc));
  local_178._0_8_ = *(ulong *)(lVar6 + lVar19 * 0xc);
  local_178._8_8_ = 0;
  local_128 = *(undefined8 *)(lVar6 + lVar21 * 0xc);
  uStack_120 = 0;
  local_108 = *(undefined8 *)(lVar6 + lVar22 * 0xc);
  uStack_100 = 0;
  local_118 = ZEXT416(*(uint *)(lVar6 + 8 + lVar22 * 0xc));
  auVar24._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar24._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar24._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar24._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar24 = vinsertps_avx(auVar24,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
  auVar25._0_4_ = (float)uVar2 + auVar24._0_4_;
  auVar25._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar24._4_4_;
  auVar25._8_4_ = auVar24._8_4_ + 0.0;
  auVar25._12_4_ = auVar24._12_4_ + 0.0;
  auVar26._8_4_ = 0x3f000000;
  auVar26._0_8_ = 0x3f0000003f000000;
  auVar26._12_4_ = 0x3f000000;
  auVar24 = vmulps_avx512vl(auVar25,auVar26);
  local_a0._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_a0._0_8_ = vmovlps_avx(auVar24);
  FVar30 = SolidAngle(this,(Point3f *)local_a0);
  if ((FVar30 < 0.0002) || (6.22 < FVar30)) {
    Sample((optional<pbrt::ShapeSample> *)local_a0,this,(Point2f *)&local_150);
    if (local_48 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    local_a0._24_4_ = ctx->time;
    auVar27._4_4_ = local_a0._12_4_;
    auVar27._0_4_ = local_a0._8_4_;
    auVar27._8_4_ = local_a0._16_4_;
    auVar27._12_4_ = local_a0._20_4_;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar24 = vinsertps_avx(auVar27,ZEXT416((uint)local_a0._20_4_),0x10);
    fVar1 = ((float)local_a0._0_4_ + (float)local_a0._4_4_) * 0.5;
    fVar45 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
             (ctx->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
    auVar29._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar29._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    auVar29._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar29._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
    auVar26 = vinsertps_avx(auVar29,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high),0x10);
    fVar78 = fVar1 - fVar45;
    auVar28._0_4_ = ((float)local_a0._12_4_ + auVar24._0_4_) * 0.5;
    auVar28._4_4_ = ((float)local_a0._16_4_ + auVar24._4_4_) * 0.5;
    auVar28._8_4_ = (auVar24._8_4_ + 0.0) * 0.5;
    auVar28._12_4_ = (auVar24._12_4_ + 0.0) * 0.5;
    auVar48._0_4_ = ((float)uVar2 + auVar26._0_4_) * 0.5;
    auVar48._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar26._4_4_) * 0.5;
    auVar48._8_4_ = (auVar26._8_4_ + 0.0) * 0.5;
    auVar48._12_4_ = (auVar26._12_4_ + 0.0) * 0.5;
    auVar26 = vsubps_avx(auVar28,auVar48);
    auVar24 = vmovshdup_avx(auVar26);
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar26._0_4_ * auVar26._0_4_)),ZEXT416((uint)fVar78),
                              ZEXT416((uint)fVar78));
    auVar24 = vfmadd231ss_fma(auVar29,auVar24,auVar24);
    if ((auVar24._0_4_ != 0.0) || (NAN(auVar24._0_4_))) {
      auVar29 = vsqrtss_avx(auVar24,auVar24);
      auVar25 = vsubps_avx(auVar48,auVar28);
      auVar24 = vmovshdup_avx(auVar25);
      auVar27 = ZEXT416((uint)(fVar45 - fVar1));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_)),auVar27,auVar27);
      auVar52._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      auVar52._8_4_ = auVar26._8_4_ ^ 0x80000000;
      auVar52._12_4_ = auVar26._12_4_ ^ 0x80000000;
      auVar26 = vfmadd231ss_fma(auVar25,auVar24,auVar24);
      auVar56._0_4_ = auVar29._0_4_;
      auVar50._0_4_ = fVar78 / auVar56._0_4_;
      auVar50._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar56._4_4_ = auVar56._0_4_;
      auVar56._8_4_ = auVar56._0_4_;
      auVar56._12_4_ = auVar56._0_4_;
      auVar24 = vdivps_avx(auVar52,auVar56);
      auVar57._4_4_ = local_a0._48_4_;
      auVar57._0_4_ = local_a0._44_4_;
      auVar57._8_8_ = 0;
      auVar62._0_4_ = auVar24._0_4_ * (float)local_a0._44_4_;
      auVar62._4_4_ = auVar24._4_4_ * (float)local_a0._48_4_;
      auVar62._8_4_ = auVar24._8_4_ * 0.0;
      auVar62._12_4_ = auVar24._12_4_ * 0.0;
      uVar13 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
      auVar60._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar60._8_4_ = -auVar62._8_4_;
      auVar60._12_4_ = -auVar62._12_4_;
      auVar29 = vpermi2ps_avx512vl(_DAT_00603510,auVar62,auVar60);
      auVar24 = vfmadd231ps_fma(auVar29,auVar57,auVar24);
      auVar24 = vhaddps_avx(auVar24,auVar24);
      auVar24 = vfnmadd231ss_fma(auVar24,auVar50,ZEXT416((uint)local_a0._40_4_));
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl(auVar24,auVar12);
      fVar45 = (float)local_a0._80_4_ / (auVar24._0_4_ / auVar26._0_4_);
      if (ABS(fVar45) != INFINITY) {
        __return_storage_ptr__->set = local_48;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_a0._64_8_;
        *(undefined8 *)&__return_storage_ptr__->optionalValue = local_a0._0_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_a0._12_4_,local_a0._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_a0._20_4_,local_a0._16_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_a0._24_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
             CONCAT44(local_a0._36_4_,local_a0._32_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_a0._44_4_,local_a0._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_a0._52_4_,local_a0._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_a0._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_a0._72_8_;
        goto LAB_002ca66e;
      }
    }
  }
  else {
    fVar45 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
    fVar78 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    fVar44 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    if ((((fVar45 != 0.0) || (fVar78 != 0.0)) || (NAN(fVar78))) ||
       ((fVar44 != 0.0 || (NAN(fVar44))))) {
      auVar16._8_8_ = uStack_100;
      auVar16._0_8_ = local_108;
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      fVar31 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high) * 0.5;
      fVar32 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high) * 0.5;
      fVar68 = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (ctx->pi).super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      fVar76 = (float)local_108 - fVar31;
      auVar24 = vmovshdup_avx(auVar16);
      fVar77 = (float)local_118._0_4_ - fVar68;
      auVar51._4_4_ = fVar31;
      auVar51._0_4_ = fVar31;
      auVar51._8_4_ = fVar31;
      auVar51._12_4_ = fVar31;
      auVar58._4_4_ = fVar68;
      auVar58._0_4_ = fVar68;
      auVar58._8_4_ = fVar68;
      auVar58._12_4_ = fVar68;
      fVar31 = auVar24._0_4_ - fVar32;
      auVar53._4_4_ = fVar32;
      auVar53._0_4_ = fVar32;
      auVar53._8_4_ = fVar32;
      auVar53._12_4_ = fVar32;
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),ZEXT416((uint)fVar76),
                                ZEXT416((uint)fVar76));
      auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      fVar32 = auVar24._0_4_;
      auVar69._0_4_ = fVar77 / fVar32;
      auVar69._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar63._0_4_ = fVar31 / fVar32;
      auVar63._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar61._0_4_ = fVar76 / fVar32;
      auVar61._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar24 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar78),
                                ZEXT416((uint)(auVar69._0_4_ * fVar44)));
      auVar26 = vfmsub213ss_fma(auVar69,ZEXT416((uint)fVar44),
                                ZEXT416((uint)(auVar69._0_4_ * fVar44)));
      auVar14._8_8_ = uStack_120;
      auVar14._0_8_ = local_128;
      auVar49._4_4_ = fVar44;
      auVar49._0_4_ = fVar44;
      auVar49._8_4_ = fVar44;
      auVar49._12_4_ = fVar44;
      auVar46._4_4_ = fVar78;
      auVar46._0_4_ = fVar78;
      auVar46._8_4_ = fVar78;
      auVar46._12_4_ = fVar78;
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + auVar26._0_4_)),ZEXT416((uint)fVar45)
                                ,auVar61);
      auVar33._4_4_ = fVar45;
      auVar33._0_4_ = fVar45;
      auVar33._8_4_ = fVar45;
      auVar33._12_4_ = fVar45;
      auVar24 = vandps_avx(auVar24,auVar75);
      local_b8 = vmaxss_avx(auVar24,ZEXT416(0x3c23d70a));
      auVar24 = vinsertps_avx(auVar14,local_178,0x1c);
      auVar27 = vsubps_avx(auVar24,auVar51);
      auVar24 = vinsertps_avx(local_178,auVar14,0x4c);
      auVar26 = vsubps_avx(auVar24,auVar53);
      auVar24 = vinsertps_avx(local_138,ZEXT416((uint)fVar1),0x10);
      auVar24 = vsubps_avx(auVar24,auVar58);
      auVar64._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar64._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar64._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar64._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar25 = vfmadd231ps_fma(auVar64,auVar27,auVar27);
      auVar25 = vfmadd231ps_fma(auVar25,auVar24,auVar24);
      auVar25 = vsqrtps_avx(auVar25);
      auVar24 = vdivps_avx(auVar24,auVar25);
      auVar26 = vdivps_avx(auVar26,auVar25);
      auVar25 = vdivps_avx(auVar27,auVar25);
      auVar65._0_4_ = fVar44 * auVar24._0_4_;
      auVar65._4_4_ = fVar44 * auVar24._4_4_;
      auVar65._8_4_ = fVar44 * auVar24._8_4_;
      auVar65._12_4_ = fVar44 * auVar24._12_4_;
      auVar26 = vfmadd213ps_fma(auVar46,auVar26,auVar65);
      auVar24 = vfmsub213ps_fma(auVar24,auVar49,auVar65);
      auVar47._0_4_ = auVar26._0_4_ + auVar24._0_4_;
      auVar47._4_4_ = auVar26._4_4_ + auVar24._4_4_;
      auVar47._8_4_ = auVar26._8_4_ + auVar24._8_4_;
      auVar47._12_4_ = auVar26._12_4_ + auVar24._12_4_;
      auVar24 = vfmadd213ps_fma(auVar33,auVar25,auVar47);
      auVar24 = vandps_avx(auVar75,auVar24);
      auVar11._8_4_ = 0x3c23d70a;
      auVar11._0_8_ = 0x3c23d70a3c23d70a;
      auVar11._12_4_ = 0x3c23d70a;
      local_c8 = vmaxps_avx512vl(auVar24,auVar11);
      auVar24 = vinsertps_avx(local_c8,local_b8,0x10);
      local_d8._0_4_ = local_c8._0_4_ + auVar24._0_4_;
      local_d8._4_4_ = local_c8._4_4_ + auVar24._4_4_;
      local_d8._8_4_ = local_c8._8_4_ + auVar24._8_4_;
      local_d8._12_4_ = local_c8._12_4_ + auVar24._12_4_;
      auVar24 = vmovshdup_avx(auVar29);
      fVar78 = auVar24._0_4_;
      auVar24 = vmovshdup_avx(local_d8);
      fVar44 = auVar24._0_4_;
      fVar45 = fVar78 * (local_d8._0_4_ + fVar44);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar44 * fVar44)),
                                ZEXT416((uint)(local_d8._0_4_ * local_d8._0_4_)),
                                ZEXT416((uint)(1.0 - fVar78)));
      if (auVar24._0_4_ < 0.0) {
        local_f8._0_4_ = fVar45;
        fVar78 = sqrtf(auVar24._0_4_);
        fVar45 = (float)local_f8._0_4_;
      }
      else {
        auVar24 = vsqrtss_avx(auVar24,auVar24);
        fVar78 = auVar24._0_4_;
      }
      auVar25 = vmovshdup_avx512vl(local_c8);
      auVar24 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar45 / (local_d8._0_4_ + fVar78))));
      fVar44 = auVar24._0_4_;
      fVar78 = 1.0 - fVar44;
      auVar26 = vmulss_avx512f(auVar25,auVar24);
      auVar27 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)fVar78),local_c8);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_b8._0_4_ * fVar44)),ZEXT416((uint)fVar78),
                                local_c8);
      auVar28 = vaddss_avx512f(auVar27,auVar26);
      auVar29 = vmulss_avx512f(auVar29,auVar28);
      auVar28 = vmulss_avx512f(auVar27,auVar27);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(u.super_Tuple2<pbrt::Point2,_float>.x *
                                              auVar26._0_4_ * auVar26._0_4_)),auVar28,
                                ZEXT416((uint)(1.0 - u.super_Tuple2<pbrt::Point2,_float>.x)));
      if (auVar26._0_4_ < 0.0) {
        uStack_140 = auVar27._0_4_;
        local_144 = auVar29._0_4_;
        local_13c = fVar78;
        local_f8 = auVar25;
        auVar38._0_4_ = sqrtf(auVar26._0_4_);
        auVar38._4_60_ = extraout_var;
        auVar26 = auVar38._0_16_;
        auVar29 = ZEXT416(local_144);
        auVar27 = ZEXT416(uStack_140);
        fVar78 = local_13c;
        auVar25 = local_f8;
      }
      else {
        auVar26 = vsqrtss_avx(auVar26,auVar26);
      }
      fVar45 = 0.0;
      auVar26 = vaddss_avx512f(auVar26,auVar27);
      auVar54._8_8_ = uStack_100;
      auVar54._0_8_ = local_108;
      auVar70._8_8_ = uStack_120;
      auVar70._0_8_ = local_128;
      auVar26 = vdivss_avx512f(auVar29,auVar26);
      auVar26 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar26);
      fVar31 = auVar26._0_4_;
      auVar24 = vinsertps_avx(auVar26,auVar24,0x10);
      local_150 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar24);
      if (((0.0 <= fVar31) && (fVar31 <= 1.0)) && ((0.0 <= fVar44 && (fVar44 <= 1.0)))) {
        auVar24 = vaddss_avx512f(local_d8,auVar25);
        fVar32 = local_b8._0_4_ + auVar24._0_4_;
        if ((fVar32 != 0.0) || (fVar45 = 1.0, NAN(fVar32))) {
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_c8._0_4_ * fVar78 * fVar31)),local_c8,
                                    ZEXT416((uint)(fVar78 * (1.0 - fVar31))));
          auVar24 = vfmadd213ss_avx512f(auVar25,ZEXT416((uint)(fVar44 * (1.0 - fVar31))),auVar24);
          auVar24 = vfmadd213ss_avx512f(local_b8,ZEXT416((uint)(fVar44 * fVar31)),auVar24);
          fVar45 = (auVar24._0_4_ * 4.0) / fVar32;
        }
      }
    }
    else {
      auVar54._8_8_ = uStack_100;
      auVar54._0_8_ = local_108;
      auVar70._8_8_ = uStack_120;
      auVar70._0_8_ = local_128;
      fVar45 = 1.0;
    }
    local_a0._0_8_ = vmovlps_avx(local_178);
    uVar2 = vmovlps_avx(auVar70);
    local_a0._12_4_ = (undefined4)uVar2;
    local_a0._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_a0._24_8_ = vmovlps_avx(auVar54);
    auVar5._0_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar5._4_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar5._8_4_ = (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar5._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar24 = vinsertps_avx(auVar5,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.high),0x10);
    auVar34._0_4_ = (float)uVar2 + auVar24._0_4_;
    auVar34._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar24._4_4_;
    auVar34._8_4_ = auVar24._8_4_ + 0.0;
    auVar34._12_4_ = auVar24._12_4_ + 0.0;
    auVar9._8_4_ = 0x3f000000;
    auVar9._0_8_ = 0x3f0000003f000000;
    auVar9._12_4_ = 0x3f000000;
    auVar24 = vmulps_avx512vl(auVar34,auVar9);
    auVar40 = ZEXT856(auVar24._8_8_);
    local_40.z = ((ctx->pi).super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
                 (ctx->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
    local_40._0_8_ = vmovlps_avx(auVar24);
    local_a0._8_4_ = fVar1;
    local_a0._20_4_ = local_138._0_4_;
    local_a0._32_4_ = local_118._0_4_;
    aVar79 = SampleSphericalTriangle
                       ((array<pbrt::Point3<float>,_3> *)local_a0,(Point3f *)&local_40,
                        (Point2f *)&local_150,&local_dc);
    fVar78 = aVar79.values[2];
    auVar39._0_8_ = aVar79.values._0_8_;
    auVar39._8_56_ = auVar40;
    if ((local_dc != 0.0) || (NAN(local_dc))) {
      fVar45 = local_dc * fVar45;
      auVar15._8_8_ = uStack_120;
      auVar15._0_8_ = local_128;
      auVar17._8_8_ = uStack_100;
      auVar17._0_8_ = local_108;
      fVar32 = aVar79.values[0];
      auVar59._0_4_ = (float)local_178._0_8_ * fVar32;
      auVar59._4_4_ = (float)((ulong)local_178._0_8_ >> 0x20) * fVar32;
      auVar59._8_4_ = fVar32 * 0.0;
      auVar59._12_4_ = fVar32 * 0.0;
      auVar29 = vmovshdup_avx(auVar39._0_16_);
      fVar76 = (float)((ulong)local_108 >> 0x20);
      fVar77 = (float)((ulong)uStack_100 >> 0x20);
      fVar31 = auVar29._0_4_;
      fVar44 = local_138._0_4_ * fVar31;
      auVar55._0_4_ = (float)local_128 * fVar31;
      auVar55._4_4_ = (float)((ulong)local_128 >> 0x20) * auVar29._4_4_;
      auVar55._8_4_ = (float)uStack_120 * auVar29._8_4_;
      auVar55._12_4_ = (float)((ulong)uStack_120 >> 0x20) * auVar29._12_4_;
      local_a0._8_4_ = local_118._0_4_ * fVar78 + fVar1 * fVar32 + fVar44;
      auVar41._0_4_ = auVar59._0_4_ + auVar55._0_4_ + (float)local_108 * fVar78;
      auVar41._4_4_ = auVar59._4_4_ + auVar55._4_4_ + fVar76 * fVar78;
      auVar41._8_4_ = auVar59._8_4_ + auVar55._8_4_ + (float)uStack_100 * fVar78;
      auVar41._12_4_ = auVar59._12_4_ + auVar55._12_4_ + fVar77 * fVar78;
      auVar24 = vblendps_avx(auVar15,auVar17,2);
      auVar25 = vsubps_avx(auVar24,local_178);
      local_a0._0_8_ = vmovlps_avx(auVar41);
      auVar66._4_4_ = fVar1;
      auVar66._0_4_ = fVar1;
      auVar66._8_4_ = fVar1;
      auVar66._12_4_ = fVar1;
      auVar24 = vinsertps_avx(local_138,local_118,0x10);
      lVar6 = *(long *)(lVar20 + 0x18);
      auVar27 = vsubps_avx(auVar24,auVar66);
      auVar24 = vblendps_avx(auVar17,auVar15,2);
      auVar28 = vsubps_avx(auVar24,local_178);
      auVar26 = vshufps_avx(auVar27,auVar27,0xe1);
      auVar24 = vinsertps_avx(auVar25,auVar27,0x1c);
      auVar72._0_4_ = auVar25._0_4_ * auVar26._0_4_;
      auVar72._4_4_ = auVar25._4_4_ * auVar26._4_4_;
      auVar72._8_4_ = auVar25._8_4_ * auVar26._8_4_;
      auVar72._12_4_ = auVar25._12_4_ * auVar26._12_4_;
      auVar48 = vfmsub213ps_fma(auVar28,auVar27,auVar72);
      auVar26 = vinsertps_avx(auVar25,auVar27,0x4c);
      auVar27 = vfnmadd213ps_fma(auVar26,auVar24,auVar72);
      auVar24 = vmovshdup_avx(auVar28);
      auVar26 = vmovshdup_avx(auVar25);
      auVar42._0_4_ = auVar48._0_4_ + auVar27._0_4_;
      auVar42._4_4_ = auVar48._4_4_ + auVar27._4_4_;
      auVar42._8_4_ = auVar48._8_4_ + auVar27._8_4_;
      auVar42._12_4_ = auVar48._12_4_ + auVar27._12_4_;
      auVar27 = ZEXT416((uint)(auVar24._0_4_ * auVar28._0_4_));
      auVar26 = vfmsub213ss_fma(auVar26,auVar25,auVar27);
      auVar24 = vfnmadd213ss_fma(auVar28,auVar24,auVar27);
      auVar71._0_4_ = auVar42._0_4_ * auVar42._0_4_;
      auVar71._4_4_ = auVar42._4_4_ * auVar42._4_4_;
      auVar71._8_4_ = auVar42._8_4_ * auVar42._8_4_;
      auVar71._12_4_ = auVar42._12_4_ * auVar42._12_4_;
      fVar78 = auVar26._0_4_ + auVar24._0_4_;
      auVar24 = vhaddps_avx(auVar71,auVar71);
      auVar24 = ZEXT416((uint)(fVar78 * fVar78 + auVar24._0_4_));
      auVar24 = vsqrtss_avx(auVar24,auVar24);
      fVar68 = auVar24._0_4_;
      auVar73._4_4_ = fVar68;
      auVar73._0_4_ = fVar68;
      auVar73._8_4_ = fVar68;
      auVar73._12_4_ = fVar68;
      fVar78 = fVar78 / fVar68;
      auVar24 = vdivps_avx(auVar42,auVar73);
      local_188 = vshufps_avx512vl(auVar24,auVar24,0xe1);
      if (lVar6 == 0) {
        if (*(char *)(lVar20 + 0x38) != *(char *)(lVar20 + 0x39)) {
          auVar24 = vshufps_avx(auVar24,auVar24,0xe1);
          local_188._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
          local_188._8_4_ = auVar24._8_4_ ^ 0x80000000;
          local_188._12_4_ = auVar24._12_4_ ^ 0x80000000;
          fVar78 = -fVar78;
        }
      }
      else {
        lVar20 = (long)*(int *)(lVar23 + lVar18 * 0xc);
        lVar19 = (long)*(int *)(lVar23 + 4 + lVar18 * 0xc);
        lVar23 = (long)*(int *)(lVar23 + 8 + lVar18 * 0xc);
        auVar26 = vinsertps_avx(auVar24,ZEXT416((uint)fVar78),0x10);
        fVar7 = (1.0 - fVar32) - fVar31;
        uVar2 = *(undefined8 *)(lVar6 + 4 + lVar20 * 0xc);
        uVar3 = *(undefined8 *)(lVar6 + 4 + lVar19 * 0xc);
        uVar4 = *(undefined8 *)(lVar6 + 4 + lVar23 * 0xc);
        auVar67._0_4_ = fVar7 * (float)uVar4 + (float)uVar3 * fVar31 + (float)uVar2 * fVar32;
        auVar67._4_4_ =
             fVar7 * (float)((ulong)uVar4 >> 0x20) +
             (float)((ulong)uVar3 >> 0x20) * auVar29._4_4_ + (float)((ulong)uVar2 >> 0x20) * fVar32;
        auVar67._8_4_ = fVar7 * 0.0 + auVar29._8_4_ * 0.0 + fVar32 * 0.0;
        auVar67._12_4_ = fVar7 * 0.0 + auVar29._12_4_ * 0.0 + fVar32 * 0.0;
        auVar29 = vmovshdup_avx(auVar67);
        fVar68 = fVar78 * auVar29._0_4_;
        auVar74._0_4_ = -fVar68;
        auVar74._4_4_ = 0x80000000;
        auVar74._8_4_ = 0x80000000;
        auVar74._12_4_ = 0x80000000;
        auVar29 = vinsertps_avx(ZEXT416((uint)fVar68),auVar74,0x10);
        auVar26 = vfmadd231ps_fma(auVar29,auVar67,auVar26);
        auVar29 = vmovshdup_avx(auVar24);
        auVar26 = vhaddps_avx(auVar26,auVar26);
        auVar26 = vfmadd213ss_fma(auVar29,ZEXT416((uint)(fVar32 * *(float *)(lVar6 + lVar20 * 0xc) +
                                                         fVar31 * *(float *)(lVar6 + lVar19 * 0xc) +
                                                        fVar7 * *(float *)(lVar6 + lVar23 * 0xc))),
                                  auVar26);
        if (auVar26._0_4_ < 0.0) {
          auVar24 = vshufps_avx(auVar24,auVar24,0xe1);
          local_188._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
          local_188._8_4_ = auVar24._8_4_ ^ 0x80000000;
          local_188._12_4_ = auVar24._12_4_ ^ 0x80000000;
        }
        uVar2 = vcmpss_avx512f(auVar26,ZEXT816(0) << 0x20,1);
        bVar8 = (bool)((byte)uVar2 & 1);
        fVar78 = (float)((uint)bVar8 * (int)-fVar78 + (uint)!bVar8 * (int)fVar78);
      }
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx(auVar59,auVar43);
      auVar26 = vandps_avx(auVar55,auVar43);
      auVar29 = vandps_avx(ZEXT416((uint)(fVar1 * fVar32)),auVar43);
      auVar25 = vandps_avx(ZEXT416((uint)fVar44),auVar43);
      fVar31 = (1.0 - fVar32) - fVar31;
      auVar35._0_4_ = (float)local_108 * fVar31;
      auVar35._4_4_ = fVar76 * fVar31;
      auVar35._8_4_ = (float)uStack_100 * fVar31;
      auVar35._12_4_ = fVar77 * fVar31;
      auVar27 = vandps_avx(ZEXT416((uint)(local_118._0_4_ * fVar31)),auVar43);
      local_40.z = (auVar29._0_4_ + auVar25._0_4_ + auVar27._0_4_) * 3.57628e-07;
      auVar29 = vandps_avx(auVar35,auVar43);
      auVar36._0_4_ = auVar24._0_4_ + auVar26._0_4_ + auVar29._0_4_;
      auVar36._4_4_ = auVar24._4_4_ + auVar26._4_4_ + auVar29._4_4_;
      auVar36._8_4_ = auVar24._8_4_ + auVar26._8_4_ + auVar29._8_4_;
      auVar36._12_4_ = auVar24._12_4_ + auVar26._12_4_ + auVar29._12_4_;
      auVar10._8_4_ = 0x34c00005;
      auVar10._0_8_ = 0x34c0000534c00005;
      auVar10._12_4_ = 0x34c00005;
      auVar24 = vmulps_avx512vl(auVar36,auVar10);
      local_40._0_8_ = vmovlps_avx(auVar24);
      Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)local_a0,
                         (Vector3f *)&local_40);
      FVar30 = ctx->time;
      __return_storage_ptr__->set = true;
      *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar30;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
      uVar2 = vmovlps_avx(local_188);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar2;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar78;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
      *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) =
           ZEXT816(0) << 0x20;
LAB_002ca66e:
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar45;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf *= BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for uniform solid angle sampled point on triangle
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time), pdf};
    }